

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

bool __thiscall OpenMesh::IO::_PLYReader_::can_u_read(_PLYReader_ *this,string *_filename)

{
  bool bVar1;
  char cVar2;
  istream local_220 [8];
  ifstream ifs;
  
  bVar1 = BaseReader::can_u_read(&this->super_BaseReader,_filename);
  if (bVar1) {
    std::ifstream::ifstream(local_220,(_filename->_M_dataplus)._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if ((cVar2 != '\0') && (bVar1 = can_u_read(this,local_220), bVar1)) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_220);
      return true;
    }
    std::ifstream::~ifstream(local_220);
  }
  return false;
}

Assistant:

bool _PLYReader_::can_u_read(const std::string& _filename) const {

    // !!! Assuming BaseReader::can_u_parse( std::string& )
    // does not call BaseReader::read_magic()!!!

    if (BaseReader::can_u_read(_filename)) {
        std::ifstream ifs(_filename.c_str());
        if (ifs.is_open() && can_u_read(ifs)) {
            ifs.close();
            return true;
        }
    }
    return false;
}